

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Window.cpp
# Opt level: O1

void __thiscall cursespp::Window::Hide(Window *this)

{
  Hide((Window *)&this[-1].lastNotifiedVisible);
  return;
}

Assistant:

void Window::Hide() {
    ASSERT_MAIN_THREAD();

    this->Blur();

    if (this->frame) {
        if (this->isVisibleInParent) {
            this->Destroy();
            this->isVisibleInParent = false;
        }
    }
    else {
        if (this->isVisibleInParent) {
            this->isVisibleInParent = false;
        }
    }

    this->NotifyVisibilityChange(false);
}